

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

void __thiscall google::anon_unknown_3::FileDescriptor::~FileDescriptor(FileDescriptor *this)

{
  int iVar1;
  int *piVar2;
  
  if (-1 < this->fd_) {
    do {
      iVar1 = close(this->fd_);
      if (-1 < iVar1) {
        return;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return;
}

Assistant:

~FileDescriptor() {
    if (fd_ >= 0) {
      NO_INTR(close(fd_));
    }
  }